

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

OneofDescriptorProto *
google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>::New
          (Arena *arena)

{
  Arena *arena_local;
  OneofDescriptorProto *local_28;
  OneofDescriptorProto *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (OneofDescriptorProto *)operator_new(0x28);
    OneofDescriptorProto::OneofDescriptorProto(local_28);
  }
  else {
    local_28 = (OneofDescriptorProto *)
               Arena::AllocateAligned(arena,(type_info *)&OneofDescriptorProto::typeinfo,0x28);
    OneofDescriptorProto::OneofDescriptorProto(local_28);
    Arena::AddListNode(arena,local_28,arena_destruct_object<google::protobuf::OneofDescriptorProto>)
    ;
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }